

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBToRGB565DitherRow_C(uint8_t *src_argb,uint8_t *dst_rgb,uint32_t dither4,int width)

{
  uint uVar1;
  uint uVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  uint in_ECX;
  uint *in_RSI;
  byte *in_RDI;
  uint8_t r0_1;
  uint8_t g0_1;
  uint8_t b0_1;
  int dither0_1;
  uint8_t r1;
  uint8_t g1;
  uint8_t b1;
  uint8_t r0;
  uint8_t g0;
  uint8_t b0;
  int dither1;
  int dither0;
  int x;
  uint local_1c;
  byte local_14 [4];
  uint *local_10;
  byte *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_1c = 0; (int)local_1c < (int)(in_ECX - 1); local_1c = local_1c + 2) {
    uVar1 = (uint)local_14[(int)(local_1c & 3)];
    uVar2 = (uint)local_14[(int)(local_1c + 1 & 3)];
    iVar3 = libyuv::clamp255(*local_8 + uVar1);
    iVar4 = libyuv::clamp255(local_8[1] + uVar1);
    iVar5 = libyuv::clamp255(local_8[2] + uVar1);
    iVar6 = libyuv::clamp255(local_8[4] + uVar2);
    iVar7 = libyuv::clamp255(local_8[5] + uVar2);
    iVar8 = libyuv::clamp255(local_8[6] + uVar2);
    *local_10 = iVar3 >> 3 & 0xffU | (iVar4 >> 2 & 0xffU) << 5 | (iVar5 >> 3 & 0xffU) << 0xb |
                (iVar6 >> 3 & 0xffU) << 0x10 | (iVar7 >> 2 & 0xffU) << 0x15 | (iVar8 >> 3) << 0x1b;
    local_10 = local_10 + 1;
    local_8 = local_8 + 8;
  }
  if ((in_ECX & 1) != 0) {
    uVar1 = (uint)local_14[(int)(in_ECX - 1 & 3)];
    iVar3 = libyuv::clamp255(*local_8 + uVar1);
    iVar4 = libyuv::clamp255(local_8[1] + uVar1);
    iVar5 = libyuv::clamp255(local_8[2] + uVar1);
    *(ushort *)local_10 =
         (ushort)(byte)(iVar3 >> 3) | (ushort)(byte)(iVar4 >> 2) << 5 |
         (ushort)(byte)(iVar5 >> 3) << 0xb;
  }
  return;
}

Assistant:

void ARGBToRGB565DitherRow_C(const uint8_t* src_argb,
                             uint8_t* dst_rgb,
                             const uint32_t dither4,
                             int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    int dither0 = ((const unsigned char*)(&dither4))[x & 3];
    int dither1 = ((const unsigned char*)(&dither4))[(x + 1) & 3];
    uint8_t b0 = clamp255(src_argb[0] + dither0) >> 3;
    uint8_t g0 = clamp255(src_argb[1] + dither0) >> 2;
    uint8_t r0 = clamp255(src_argb[2] + dither0) >> 3;
    uint8_t b1 = clamp255(src_argb[4] + dither1) >> 3;
    uint8_t g1 = clamp255(src_argb[5] + dither1) >> 2;
    uint8_t r1 = clamp255(src_argb[6] + dither1) >> 3;
    WRITEWORD(dst_rgb, b0 | (g0 << 5) | (r0 << 11) | (b1 << 16) | (g1 << 21) |
                           (r1 << 27));
    dst_rgb += 4;
    src_argb += 8;
  }
  if (width & 1) {
    int dither0 = ((const unsigned char*)(&dither4))[(width - 1) & 3];
    uint8_t b0 = clamp255(src_argb[0] + dither0) >> 3;
    uint8_t g0 = clamp255(src_argb[1] + dither0) >> 2;
    uint8_t r0 = clamp255(src_argb[2] + dither0) >> 3;
    *(uint16_t*)(dst_rgb) = b0 | (g0 << 5) | (r0 << 11);
  }
}